

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O0

void result_tests::ExpectResult<int>(Result<int> *result,bool success,bilingual_str *str)

{
  bool bVar1;
  lazy_ostream *in_RDX;
  byte in_SIL;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffe68;
  lazy_ostream *in_stack_fffffffffffffe70;
  basic_cstring<const_char> *in_stack_fffffffffffffe78;
  const_string *in_stack_fffffffffffffe90;
  const_string *msg;
  size_t in_stack_fffffffffffffe98;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffea0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffea8;
  char *this;
  undefined1 local_f8 [16];
  undefined1 local_e8 [32];
  const_string local_c8;
  undefined1 local_b8 [23];
  undefined1 local_a1;
  undefined1 local_a0 [16];
  undefined1 local_90 [71];
  lazy_ostream local_49 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_49[0]._vptr_lazy_ostream._0_1_ = in_SIL & 1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffe78,(pointer)in_stack_fffffffffffffe70,
               (unsigned_long)in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe70,(char (*) [1])in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffe78,(pointer)in_stack_fffffffffffffe70,
               (unsigned_long)in_stack_fffffffffffffe68);
    local_a1 = util::Result::operator_cast_to_bool((Result<int> *)in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe78 = (basic_cstring<const_char> *)0x1ca075c;
    in_stack_fffffffffffffe70 = local_49;
    in_stack_fffffffffffffe68 = "bool(result)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_90,local_a0,0x39,1,2,&local_a1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
    ;
    line_num = local_b8;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffe78,(pointer)in_stack_fffffffffffffe70,
               (unsigned_long)in_stack_fffffffffffffe68);
    file = &local_c8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe70,(char (*) [1])in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffe78,(pointer)in_stack_fffffffffffffe70,
               (unsigned_long)in_stack_fffffffffffffe68);
    util::ErrorString<int>((Result<int> *)file);
    in_stack_fffffffffffffe78 = (basic_cstring<const_char> *)0x1bdceaa;
    in_stack_fffffffffffffe68 = "util::ErrorString(result)";
    in_stack_fffffffffffffe70 = in_RDX;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
              (local_e8,local_f8,0x3a,1,2,(undefined1 *)((long)&local_49[0]._vptr_lazy_ostream + 1))
    ;
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffe68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ExpectResult(const util::Result<T>& result, bool success, const bilingual_str& str)
{
    BOOST_CHECK_EQUAL(bool(result), success);
    BOOST_CHECK_EQUAL(util::ErrorString(result), str);
}